

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_epoll.c
# Opt level: O3

void setUp(void)

{
  memset(&fff,0,0x194);
  memset(&epoll_create1_fake,0,0x1d0);
  epoll_create1_fake.arg_history_len = 0x32;
  memset(&eventfd_fake,0,0x298);
  eventfd_fake.arg_history_len = 0x32;
  memset(&epoll_ctl_fake,0,0x500);
  epoll_ctl_fake.arg_history_len = 0x32;
  memset(&epoll_wait_fake,0,0x500);
  epoll_wait_fake.arg_history_len = 0x32;
  memset(&close_fake,0,0x1d0);
  close_fake.arg_history_len = 0x32;
  memset(&epoll_callback_fake,0,0x288);
  epoll_callback_fake.arg_history_len = 0x32;
  memset(&epoll_callback_second_fd_fake,0,0x288);
  epoll_callback_second_fd_fake.arg_history_len = 0x32;
  memset(&epoll_callback_third_fd_fake,0,0x288);
  epoll_callback_third_fd_fake.arg_history_len = 0x32;
  memset(&epoll_callback_forth_fd_fake,0,0x288);
  epoll_callback_forth_fd_fake.arg_history_len = 0x32;
  memset(&epoll_callback_remove_third_fd_fake,0,0x288);
  epoll_callback_remove_third_fd_fake.arg_history_len = 0x32;
  memset(&epoll_callback_remove_loop_fake,0,0x288);
  epoll_callback_remove_loop_fake.arg_history_len = 0x32;
  memset(&epoll_callback_unregister_read_second_fd_fake,0,0x288);
  epoll_callback_unregister_read_second_fd_fake.arg_history_len = 0x32;
  events_in_list = 0;
  return;
}

Assistant:

void setUp(void)
{
	FFF_RESET_HISTORY()

	RESET_FAKE(epoll_create1)
	RESET_FAKE(eventfd)
	RESET_FAKE(epoll_ctl)
	RESET_FAKE(epoll_wait)
	RESET_FAKE(close)
	RESET_FAKE(epoll_callback)
	RESET_FAKE(epoll_callback_second_fd)
	RESET_FAKE(epoll_callback_third_fd)
	RESET_FAKE(epoll_callback_forth_fd)
	RESET_FAKE(epoll_callback_remove_third_fd)
	RESET_FAKE(epoll_callback_remove_loop)
	RESET_FAKE(epoll_callback_unregister_read_second_fd)
	events_in_list = 0;
}